

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_2d_copy_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  ushort uVar6;
  uint16_t uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t tmp;
  CONV_BUF_TYPE res;
  int x;
  int y;
  int round_offset;
  int offset_bits;
  int bits;
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  int in_stack_ffffffffffffffac;
  int local_48;
  int local_44;
  
  lVar4 = *(long *)(_tmp + 2);
  iVar1 = _tmp[4];
  iVar2 = _tmp[6];
  iVar3 = _tmp[5];
  cVar5 = ((char)x + '\x0e') - (char)_tmp[5];
  iVar8 = (1 << (cVar5 - (char)_tmp[6] & 0x1fU)) + (1 << ((cVar5 - (char)_tmp[6]) - 1U & 0x1f));
  for (local_44 = 0; local_44 < in_R9D; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
      uVar6 = (*(short *)(in_RDI + (long)(local_44 * in_ESI + local_48) * 2) <<
              (('\x0e' - (char)iVar2) - (char)iVar3 & 0x1fU)) + (short)iVar8;
      if (*_tmp == 0) {
        *(ushort *)(lVar4 + (long)(local_44 * iVar1 + local_48) * 2) = uVar6;
      }
      else {
        uVar9 = (uint)*(ushort *)(lVar4 + (long)(local_44 * iVar1 + local_48) * 2);
        if (_tmp[9] == 0) {
          iVar10 = (int)(uVar6 + uVar9) >> 1;
        }
        else {
          iVar10 = (int)(uVar9 * _tmp[10] + (uint)uVar6 * _tmp[0xb]) >> 4;
        }
        uVar7 = clip_pixel_highbd(iVar10 - iVar8,in_stack_ffffffffffffffac);
        *(uint16_t *)(in_RDX + (long)(local_44 * in_ECX + local_48) * 2) = uVar7;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_c(const uint16_t *src, int src_stride,
                                            uint16_t *dst, int dst_stride,
                                            int w, int h,
                                            ConvolveParams *conv_params,
                                            int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  assert(bits >= 0);

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      CONV_BUF_TYPE res = src[y * src_stride + x] << bits;
      res += round_offset;
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}